

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::resolveTag(QXmlStreamReaderPrivate *this)

{
  qsizetype qVar1;
  QStringView prefix_00;
  QStringView prefix_01;
  bool bVar2;
  bool bVar3;
  qsizetype qVar4;
  DtdAttribute *pDVar5;
  NamespaceDeclaration *pNVar6;
  Tag *pTVar7;
  QXmlStreamReaderPrivate *pQVar8;
  QStringView *this_00;
  QChar fillChar;
  long in_RDI;
  long in_FS_OFFSET;
  QStringView QVar9;
  qsizetype i_2;
  DtdAttribute *dtdAttribute_1;
  DtdAttribute *__end1;
  DtdAttribute *__begin1;
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute> *__range1;
  qsizetype j;
  Attribute *attrib;
  QXmlStreamAttribute *attribute;
  qsizetype i_1;
  NamespaceDeclaration *namespaceDeclaration_1;
  NamespaceDeclaration *namespaceDeclaration;
  qsizetype i;
  DtdAttribute *dtdAttribute;
  DtdAttribute *__end2;
  DtdAttribute *__begin2;
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute> *__range2;
  qsizetype n;
  XmlStringRef attributeNamespaceUri_1;
  XmlStringRef attributeNamespaceUri;
  XmlStringRef value;
  XmlStringRef qualifiedName;
  XmlStringRef name;
  XmlStringRef prefix;
  XmlStringRef namespaceUri;
  XmlStringRef namespacePrefix;
  XmlStringRef ns;
  QXmlStreamAttribute attribute_1;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_serialization_qxmlstream_cpp:1630:52)>
  attributeStackCleaner;
  undefined4 in_stack_fffffffffffff798;
  int in_stack_fffffffffffff79c;
  QXmlStreamReaderPrivate *in_stack_fffffffffffff7a0;
  Value *in_stack_fffffffffffff7a8;
  int fieldWidth;
  QChar *str;
  QXmlStreamReaderPrivate *in_stack_fffffffffffff7b0;
  QString *in_stack_fffffffffffff7b8;
  undefined7 in_stack_fffffffffffff7c0;
  undefined1 in_stack_fffffffffffff7c7;
  XmlStringRef *in_stack_fffffffffffff7c8;
  XmlStringRef *in_stack_fffffffffffff7d0;
  bool local_81b;
  QXmlStreamReaderPrivate *in_stack_fffffffffffff7e8;
  QXmlStreamReaderPrivate *this_01;
  bool local_7c9;
  qsizetype in_stack_fffffffffffff850;
  reference in_stack_fffffffffffff858;
  bool local_799;
  bool local_6e5;
  bool local_691;
  bool local_662;
  bool local_653;
  qsizetype local_630;
  QXmlStreamReaderPrivate *local_618;
  long local_600;
  qsizetype local_5e8;
  qsizetype local_5d0;
  DtdAttribute *local_5b8;
  QChar local_4a8 [8];
  undefined1 *local_498;
  undefined1 *puStack_490;
  undefined1 *local_488;
  XmlStringRef local_468;
  XmlStringRef local_450 [2];
  QChar local_41a;
  QStringView local_418;
  QStringView local_3d8;
  QStringView local_3c8;
  QStringView local_3b8;
  qsizetype local_3a8;
  storage_type_conflict *local_3a0;
  QStringView local_398;
  QStringView local_388;
  undefined1 *local_378;
  undefined1 *puStack_370;
  undefined1 *local_368;
  undefined1 *local_338;
  undefined1 *puStack_330;
  undefined1 *local_328;
  undefined1 *local_2d8;
  undefined1 *puStack_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2b8;
  undefined1 *puStack_2b0;
  undefined1 *local_2a8;
  undefined1 *local_298;
  undefined1 *puStack_290;
  undefined1 *local_288;
  XmlStringRef local_278 [2];
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  QLatin1StringView local_218;
  QLatin1StringView local_1f8;
  QLatin1StringView local_1d8;
  QLatin1StringView local_1b8;
  XmlStringRef local_198;
  QString *local_178;
  qsizetype qStack_170;
  qsizetype local_168;
  QLatin1StringView local_160;
  QLatin1StringView local_128;
  QLatin1StringView local_108;
  QString *local_e8;
  qsizetype qStack_e0;
  qsizetype local_d8;
  QLatin1StringView local_c8;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  qScopeGuard<QXmlStreamReaderPrivate::resolveTag()::__0>
            ((anon_class_8_1_8991fb9c_for_m_func *)
             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  qVar4 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::size
                    ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)(in_RDI + 0x3e0));
  if ((*(ushort *)(in_RDI + 0x3a8) >> 0xc & 1) != 0) {
    local_5b8 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute>::begin
                          ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute> *)
                           (in_RDI + 0x1f8));
    pDVar5 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute>::end
                       ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute> *)
                        in_stack_fffffffffffff7a0);
    for (; local_5b8 != pDVar5; local_5b8 = local_5b8 + 1) {
      if (((((local_5b8->isNamespaceAttribute & 1U) != 0) &&
           (bVar2 = QtPrivate::XmlStringRef::isNull(&local_5b8->defaultValue), !bVar2)) &&
          (bVar2 = QtPrivate::operator!=
                             (in_stack_fffffffffffff7c8,
                              (XmlStringRef *)
                              CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0)), !bVar2
          )) && (bVar2 = QtPrivate::XmlStringRef::isNull(&local_5b8->attributeQualifiedName), !bVar2
                )) {
        local_5d0 = 0;
        while( true ) {
          local_653 = false;
          if (local_5d0 < qVar4) {
            QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::operator[]
                      ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)(in_RDI + 0x3e0)
                       ,local_5d0);
            symName(in_stack_fffffffffffff7a0,
                    (Value *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
            local_653 = QtPrivate::operator!=
                                  (in_stack_fffffffffffff7c8,
                                   (XmlStringRef *)
                                   CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
          }
          if (local_653 == false) break;
          local_5d0 = local_5d0 + 1;
        }
        if (local_5d0 == qVar4) {
          bVar2 = QtPrivate::XmlStringRef::isEmpty(&local_5b8->attributePrefix);
          local_662 = false;
          if (bVar2) {
            std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x643d1b);
            QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x643d30);
            QStringView::QStringView<QChar,_true>
                      ((QStringView *)in_stack_fffffffffffff7b0,(QChar *)in_stack_fffffffffffff7a8,
                       (qsizetype)in_stack_fffffffffffff7a0);
            local_c8 = Qt::Literals::StringLiterals::operator____L1
                                 ((char *)in_stack_fffffffffffff7a8,
                                  (size_t)in_stack_fffffffffffff7a0);
            local_662 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
          }
          if (local_662 == false) {
            std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x644091);
            QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x6440a6);
            QStringView::QStringView<QChar,_true>
                      ((QStringView *)in_stack_fffffffffffff7b0,(QChar *)in_stack_fffffffffffff7a8,
                       (qsizetype)in_stack_fffffffffffff7a0);
            local_160 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffff7a8,
                                   (size_t)in_stack_fffffffffffff7a0);
            bVar2 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
            if (bVar2) {
              pNVar6 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                                 ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>
                                   *)in_stack_fffffffffffff7a0);
              local_168 = (local_5b8->attributeName).m_size;
              local_178 = (local_5b8->attributeName).m_string;
              qStack_170 = (local_5b8->attributeName).m_pos;
              local_198.m_size = (local_5b8->defaultValue).m_size;
              local_198.m_string = (local_5b8->defaultValue).m_string;
              local_198.m_pos = (local_5b8->defaultValue).m_pos;
              std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x6441f9);
              QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64420e);
              QStringView::QStringView<QChar,_true>
                        ((QStringView *)in_stack_fffffffffffff7b0,(QChar *)in_stack_fffffffffffff7a8
                         ,(qsizetype)in_stack_fffffffffffff7a0);
              local_1b8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff7a8,
                                     (size_t)in_stack_fffffffffffff7a0);
              bVar2 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
              std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x6442b1);
              QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x6442c6);
              QStringView::QStringView<QChar,_true>
                        ((QStringView *)in_stack_fffffffffffff7b0,(QChar *)in_stack_fffffffffffff7a8
                         ,(qsizetype)in_stack_fffffffffffff7a0);
              local_1d8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff7a8,
                                     (size_t)in_stack_fffffffffffff7a0);
              bVar3 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
              local_6e5 = true;
              if (bVar2 == bVar3) {
                std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64437f);
                QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x644394);
                QStringView::QStringView<QChar,_true>
                          ((QStringView *)in_stack_fffffffffffff7b0,
                           (QChar *)in_stack_fffffffffffff7a8,(qsizetype)in_stack_fffffffffffff7a0);
                local_1f8 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)in_stack_fffffffffffff7a8,
                                       (size_t)in_stack_fffffffffffff7a0);
                bVar2 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
                local_6e5 = true;
                if (!bVar2) {
                  bVar2 = QtPrivate::XmlStringRef::isEmpty(&local_198);
                  local_6e5 = true;
                  if (!bVar2) {
                    std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x644472);
                    QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>
                              ((XmlStringRef *)0x644487);
                    QStringView::QStringView<QChar,_true>
                              ((QStringView *)in_stack_fffffffffffff7b0,
                               (QChar *)in_stack_fffffffffffff7a8,
                               (qsizetype)in_stack_fffffffffffff7a0);
                    local_218 = Qt::Literals::StringLiterals::operator____L1
                                          ((char *)in_stack_fffffffffffff7a8,
                                           (size_t)in_stack_fffffffffffff7a0);
                    local_6e5 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                             (QLatin1StringView *)
                                             CONCAT44(in_stack_fffffffffffff79c,
                                                      in_stack_fffffffffffff798));
                  }
                }
              }
              if (local_6e5 != false) {
                QXmlStream::tr((char *)in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,
                               in_stack_fffffffffffff79c);
                raiseWellFormedError
                          (in_stack_fffffffffffff7a0,
                           (QString *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798))
                ;
                QString::~QString((QString *)0x64453a);
              }
              (pNVar6->prefix).m_string = local_178;
              (pNVar6->prefix).m_pos = qStack_170;
              (pNVar6->prefix).m_size = local_168;
              (pNVar6->namespaceUri).m_string = local_198.m_string;
              (pNVar6->namespaceUri).m_pos = local_198.m_pos;
              (pNVar6->namespaceUri).m_size = local_198.m_size;
            }
          }
          else {
            pNVar6 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                               ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>
                                 *)in_stack_fffffffffffff7a0);
            QtPrivate::XmlStringRef::clear(&pNVar6->prefix);
            local_d8 = (local_5b8->defaultValue).m_size;
            local_e8 = (local_5b8->defaultValue).m_string;
            qStack_e0 = (local_5b8->defaultValue).m_pos;
            std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x643e69);
            QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x643e7e);
            QStringView::QStringView<QChar,_true>
                      ((QStringView *)in_stack_fffffffffffff7b0,(QChar *)in_stack_fffffffffffff7a8,
                       (qsizetype)in_stack_fffffffffffff7a0);
            local_108 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffff7a8,
                                   (size_t)in_stack_fffffffffffff7a0);
            bVar2 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
            local_691 = true;
            if (!bVar2) {
              std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x643f2b);
              QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x643f40);
              QStringView::QStringView<QChar,_true>
                        ((QStringView *)in_stack_fffffffffffff7b0,(QChar *)in_stack_fffffffffffff7a8
                         ,(qsizetype)in_stack_fffffffffffff7a0);
              local_128 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff7a8,
                                     (size_t)in_stack_fffffffffffff7a0);
              local_691 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                       (QLatin1StringView *)
                                       CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798)
                                      );
            }
            if (local_691 == false) {
              (pNVar6->namespaceUri).m_string = local_e8;
              (pNVar6->namespaceUri).m_pos = qStack_e0;
              (pNVar6->namespaceUri).m_size = local_d8;
            }
            else {
              QXmlStream::tr((char *)in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,
                             in_stack_fffffffffffff79c);
              raiseWellFormedError
                        (in_stack_fffffffffffff7a0,
                         (QString *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
              QString::~QString((QString *)0x643ff3);
            }
          }
        }
      }
    }
  }
  std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x644621);
  QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x644636);
  QStringView::QStringView<QChar,_true>
            ((QStringView *)in_stack_fffffffffffff7b0,(QChar *)in_stack_fffffffffffff7a8,
             (qsizetype)in_stack_fffffffffffff7a0);
  QVar9.m_data = (storage_type_conflict *)in_stack_fffffffffffff858;
  QVar9.m_size = in_stack_fffffffffffff850;
  namespaceForPrefix(in_stack_fffffffffffff7e8,QVar9);
  *(undefined8 *)(in_RDI + 0x2c8) = local_238;
  *(undefined8 *)(in_RDI + 0x2b8) = local_248;
  *(undefined8 *)(in_RDI + 0x2c0) = uStack_240;
  pTVar7 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::top
                     ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag> *)(in_RDI + 0x48));
  (pTVar7->namespaceDeclaration).namespaceUri.m_size = *(qsizetype *)(in_RDI + 0x2c8);
  qVar1 = *(qsizetype *)(in_RDI + 0x2c0);
  (pTVar7->namespaceDeclaration).namespaceUri.m_string = *(QString **)(in_RDI + 0x2b8);
  (pTVar7->namespaceDeclaration).namespaceUri.m_pos = qVar1;
  QList<QXmlStreamAttribute>::resize
            ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff7b0,
             (qsizetype)in_stack_fffffffffffff7a8);
  local_5e8 = 0;
  do {
    if (qVar4 <= local_5e8) {
      local_618 = (QXmlStreamReaderPrivate *)
                  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute>::begin
                            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute> *)
                             (in_RDI + 0x1f8));
      pQVar8 = (QXmlStreamReaderPrivate *)
               QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute>::end
                         ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute> *)
                          in_stack_fffffffffffff7a0);
      this_01 = pQVar8;
      for (; local_618 != pQVar8; local_618 = (QXmlStreamReaderPrivate *)&local_618->dataBuffer) {
        if (((local_618->rawReadBuffer).d.size & 0x100) == 0) {
          bVar2 = QtPrivate::XmlStringRef::isNull((XmlStringRef *)&local_618->q_ptr);
          if (!bVar2) {
            bVar2 = QtPrivate::operator!=
                              (in_stack_fffffffffffff7c8,
                               (XmlStringRef *)
                               CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
            if (!bVar2) {
              bVar2 = QtPrivate::XmlStringRef::isNull
                                ((XmlStringRef *)
                                 &(local_618->super_QXmlStreamPrivateTagStack).tagStackStringStorage
                                );
              if (!bVar2) {
                local_630 = 0;
                while( true ) {
                  local_81b = false;
                  if (local_630 < qVar4) {
                    QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::operator[]
                              ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)
                               (in_RDI + 0x3e0),local_630);
                    symName(in_stack_fffffffffffff7a0,
                            (Value *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
                    local_81b = QtPrivate::operator!=
                                          (in_stack_fffffffffffff7c8,
                                           (XmlStringRef *)
                                           CONCAT17(in_stack_fffffffffffff7c7,
                                                    in_stack_fffffffffffff7c0));
                  }
                  if (local_81b == false) break;
                  local_630 = local_630 + 1;
                }
                if (local_630 == qVar4) {
                  local_28 = &DAT_aaaaaaaaaaaaaaaa;
                  local_38 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
                  local_48 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
                  local_58 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                  local_68 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
                  local_78 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
                  local_88 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
                  QXmlStreamAttribute::QXmlStreamAttribute
                            ((QXmlStreamAttribute *)
                             CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
                  QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_fffffffffffff7d0);
                  in_stack_fffffffffffff7d0 = local_450;
                  QtPrivate::QXmlString::operator=
                            ((QXmlString *)in_stack_fffffffffffff7a0,
                             (QXmlString *)
                             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
                  QtPrivate::QXmlString::~QXmlString((QXmlString *)0x645149);
                  QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_fffffffffffff7d0);
                  in_stack_fffffffffffff7c8 = &local_468;
                  QtPrivate::QXmlString::operator=
                            ((QXmlString *)in_stack_fffffffffffff7a0,
                             (QXmlString *)
                             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
                  QtPrivate::QXmlString::~QXmlString((QXmlString *)0x645188);
                  QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_fffffffffffff7d0);
                  QtPrivate::QXmlString::operator=
                            ((QXmlString *)in_stack_fffffffffffff7a0,
                             (QXmlString *)
                             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
                  QtPrivate::QXmlString::~QXmlString((QXmlString *)0x6451c7);
                  in_stack_fffffffffffff7c7 =
                       QtPrivate::XmlStringRef::isEmpty
                                 ((XmlStringRef *)
                                  &(local_618->super_QXmlStreamPrivateTagStack).
                                   tagStackStringStorageSize);
                  if (!(bool)in_stack_fffffffffffff7c7) {
                    local_498 = &DAT_aaaaaaaaaaaaaaaa;
                    puStack_490 = &DAT_aaaaaaaaaaaaaaaa;
                    local_488 = &DAT_aaaaaaaaaaaaaaaa;
                    str = local_4a8;
                    this_00 = (QStringView *)
                              std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64524b);
                    QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>
                              ((XmlStringRef *)0x64525d);
                    QStringView::QStringView<QChar,_true>
                              (this_00,str,(qsizetype)in_stack_fffffffffffff7a0);
                    prefix_01.m_data = (storage_type_conflict *)in_stack_fffffffffffff858;
                    prefix_01.m_size = in_stack_fffffffffffff850;
                    namespaceForPrefix(this_01,prefix_01);
                    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_fffffffffffff7d0);
                    QtPrivate::QXmlString::operator=
                              ((QXmlString *)in_stack_fffffffffffff7a0,
                               (QXmlString *)
                               CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
                    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x645301);
                  }
                  local_28 = (undefined1 *)((ulong)local_28 | 1);
                  QList<QXmlStreamAttribute>::append
                            ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff7a0,
                             (rvalue_ref)
                             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
                  QXmlStreamAttribute::~QXmlStreamAttribute
                            ((QXmlStreamAttribute *)in_stack_fffffffffffff7a0);
                }
              }
            }
          }
        }
      }
LAB_0064538e:
      QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/serialization/qxmlstream.cpp:1630:52)>
      ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_serialization_qxmlstream_cpp:1630:52)>
                      *)in_stack_fffffffffffff7a0);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<QXmlStreamAttribute>::operator[]
              ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff7a0,
               CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::operator[]
              ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)(in_RDI + 0x3e0),
               local_5e8);
    local_278[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_278[0].m_string = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_278[0].m_pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    symPrefix(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    local_298 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_290 = &DAT_aaaaaaaaaaaaaaaa;
    local_288 = &DAT_aaaaaaaaaaaaaaaa;
    symString(in_stack_fffffffffffff7a0,
              (Value *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
    symName(in_stack_fffffffffffff7a0,
            (Value *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
    symString(in_stack_fffffffffffff7a0,
              (Value *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_fffffffffffff7d0);
    QtPrivate::QXmlString::operator=
              ((QXmlString *)in_stack_fffffffffffff7a0,
               (QXmlString *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x644901);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_fffffffffffff7d0);
    QtPrivate::QXmlString::operator=
              ((QXmlString *)in_stack_fffffffffffff7a0,
               (QXmlString *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x644946);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_fffffffffffff7d0);
    QtPrivate::QXmlString::operator=
              ((QXmlString *)in_stack_fffffffffffff7a0,
               (QXmlString *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x64498b);
    bVar2 = QtPrivate::XmlStringRef::isEmpty(local_278);
    if (!bVar2) {
      local_338 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_330 = &DAT_aaaaaaaaaaaaaaaa;
      local_328 = &DAT_aaaaaaaaaaaaaaaa;
      std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x644a10);
      QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x644a25);
      QStringView::QStringView<QChar,_true>
                ((QStringView *)in_stack_fffffffffffff7b0,(QChar *)in_stack_fffffffffffff7a8,
                 (qsizetype)in_stack_fffffffffffff7a0);
      prefix_00.m_data = (storage_type_conflict *)in_stack_fffffffffffff858;
      prefix_00.m_size = in_stack_fffffffffffff850;
      namespaceForPrefix(in_stack_fffffffffffff7e8,prefix_00);
      local_368 = local_328;
      local_378 = local_338;
      puStack_370 = puStack_330;
      QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_fffffffffffff7d0);
      QtPrivate::QXmlString::operator=
                ((QXmlString *)in_stack_fffffffffffff7a0,
                 (QXmlString *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
      QtPrivate::QXmlString::~QXmlString((QXmlString *)0x644acf);
    }
    for (local_600 = 0; local_600 < local_5e8; local_600 = local_600 + 1) {
      QList<QXmlStreamAttribute>::operator[]
                ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff7a0,
                 CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
      QVar9 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x644b24);
      local_388 = QVar9;
      QVar9 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x644b63);
      local_398 = QVar9;
      bVar2 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                           (QStringView *)
                           CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
      local_799 = false;
      if (bVar2) {
        in_stack_fffffffffffff858 =
             QList<QXmlStreamAttribute>::operator[]
                       ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff7a0,
                        CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
        QVar9 = QXmlStreamAttribute::namespaceUri((QXmlStreamAttribute *)0x644bf2);
        local_3a0 = QVar9.m_data;
        in_stack_fffffffffffff850 = QVar9.m_size;
        local_3a8 = in_stack_fffffffffffff850;
        QVar9 = QXmlStreamAttribute::namespaceUri((QXmlStreamAttribute *)0x644c31);
        local_3b8 = QVar9;
        bVar2 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                             (QStringView *)
                             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
        local_799 = false;
        if (bVar2) {
          local_7c9 = true;
          if ((*(ushort *)(in_RDI + 0x3a8) >> 0xc & 1) == 0) {
            QList<QXmlStreamAttribute>::operator[]
                      ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff7a0,
                       CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
            QVar9 = QXmlStreamAttribute::qualifiedName((QXmlStreamAttribute *)0x644cec);
            local_3c8 = QVar9;
            QVar9 = QXmlStreamAttribute::qualifiedName((QXmlStreamAttribute *)0x644d2b);
            local_3d8 = QVar9;
            local_7c9 = ::operator==((QStringView *)in_stack_fffffffffffff7a0,
                                     (QStringView *)
                                     CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
          }
          local_799 = local_7c9;
        }
      }
      if (local_799 != false) {
        QXmlStream::tr((char *)in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,
                       in_stack_fffffffffffff79c);
        fieldWidth = (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20);
        local_418 = QXmlStreamAttribute::qualifiedName((QXmlStreamAttribute *)0x644db7);
        fillChar.ucs = local_418.m_data._6_2_;
        QChar::QChar<char16_t,_true>(&local_41a,L' ');
        QString::arg<QStringView,_true>
                  (in_stack_fffffffffffff7b8,(QStringView *)in_stack_fffffffffffff7b0,fieldWidth,
                   fillChar);
        raiseWellFormedError
                  (in_stack_fffffffffffff7a0,
                   (QString *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
        QString::~QString((QString *)0x644e3d);
        QString::~QString((QString *)0x644e4a);
        goto LAB_0064538e;
      }
    }
    local_5e8 = local_5e8 + 1;
  } while( true );
}

Assistant:

void QXmlStreamReaderPrivate::resolveTag()
{
    const auto attributeStackCleaner = qScopeGuard([this](){ attributeStack.clear(); });
    const qsizetype n = attributeStack.size();

    if (namespaceProcessing) {
        for (DtdAttribute &dtdAttribute : dtdAttributes) {
            if (!dtdAttribute.isNamespaceAttribute
                || dtdAttribute.defaultValue.isNull()
                || dtdAttribute.tagName != qualifiedName
                || dtdAttribute.attributeQualifiedName.isNull())
                continue;
            qsizetype i = 0;
            while (i < n && symName(attributeStack[i].key) != dtdAttribute.attributeQualifiedName)
                ++i;
            if (i != n)
                continue;
            if (dtdAttribute.attributePrefix.isEmpty() && dtdAttribute.attributeName == "xmlns"_L1) {
                NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
                namespaceDeclaration.prefix.clear();

                const XmlStringRef ns(dtdAttribute.defaultValue);
                if (ns == "http://www.w3.org/2000/xmlns/"_L1 ||
                   ns == "http://www.w3.org/XML/1998/namespace"_L1)
                    raiseWellFormedError(QXmlStream::tr("Illegal namespace declaration."));
                else
                    namespaceDeclaration.namespaceUri = ns;
            } else if (dtdAttribute.attributePrefix == "xmlns"_L1) {
                NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
                XmlStringRef namespacePrefix = dtdAttribute.attributeName;
                XmlStringRef namespaceUri = dtdAttribute.defaultValue;
                if (((namespacePrefix == "xml"_L1)
                     ^ (namespaceUri == "http://www.w3.org/XML/1998/namespace"_L1))
                    || namespaceUri == "http://www.w3.org/2000/xmlns/"_L1
                    || namespaceUri.isEmpty()
                    || namespacePrefix == "xmlns"_L1)
                    raiseWellFormedError(QXmlStream::tr("Illegal namespace declaration."));

                namespaceDeclaration.prefix = namespacePrefix;
                namespaceDeclaration.namespaceUri = namespaceUri;
            }
        }
    }

    tagStack.top().namespaceDeclaration.namespaceUri = namespaceUri = namespaceForPrefix(prefix);

    attributes.resize(n);

    for (qsizetype i = 0; i < n; ++i) {
        QXmlStreamAttribute &attribute = attributes[i];
        Attribute &attrib = attributeStack[i];
        XmlStringRef prefix(symPrefix(attrib.key));
        XmlStringRef name(symString(attrib.key));
        XmlStringRef qualifiedName(symName(attrib.key));
        XmlStringRef value(symString(attrib.value));

        attribute.m_name = name;
        attribute.m_qualifiedName = qualifiedName;
        attribute.m_value = value;

        if (!prefix.isEmpty()) {
            XmlStringRef attributeNamespaceUri = namespaceForPrefix(prefix);
            attribute.m_namespaceUri = XmlStringRef(attributeNamespaceUri);
        }

        for (qsizetype j = 0; j < i; ++j) {
            if (attributes[j].name() == attribute.name()
                && attributes[j].namespaceUri() == attribute.namespaceUri()
                && (namespaceProcessing || attributes[j].qualifiedName() == attribute.qualifiedName()))
            {
                raiseWellFormedError(QXmlStream::tr("Attribute '%1' redefined.").arg(attribute.qualifiedName()));
                return;
            }
        }
    }

    for (DtdAttribute &dtdAttribute : dtdAttributes) {
        if (dtdAttribute.isNamespaceAttribute
            || dtdAttribute.defaultValue.isNull()
            || dtdAttribute.tagName != qualifiedName
            || dtdAttribute.attributeQualifiedName.isNull())
            continue;
        qsizetype i = 0;
        while (i < n && symName(attributeStack[i].key) != dtdAttribute.attributeQualifiedName)
            ++i;
        if (i != n)
            continue;



        QXmlStreamAttribute attribute;
        attribute.m_name = dtdAttribute.attributeName;
        attribute.m_qualifiedName = dtdAttribute.attributeQualifiedName;
        attribute.m_value = dtdAttribute.defaultValue;

        if (!dtdAttribute.attributePrefix.isEmpty()) {
            XmlStringRef attributeNamespaceUri = namespaceForPrefix(dtdAttribute.attributePrefix);
            attribute.m_namespaceUri = XmlStringRef(attributeNamespaceUri);
        }
        attribute.m_isDefault = true;
        attributes.append(std::move(attribute));
    }
}